

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O1

void __thiscall TPZAnalysis::Read(TPZAnalysis *this,TPZStream *buf,void *context)

{
  TPZSavable *pTVar1;
  TPZGeoMesh *pTVar2;
  TPZCompMesh *pTVar3;
  TPZGraphMesh *pTVar4;
  TPZSolver *pTVar5;
  void *context_00;
  int tmp;
  TPZAutoPointer<TPZStructMatrix> local_40;
  TPZAutoPointer<TPZSavable> local_38;
  TPZAutoPointer<TPZSavable> local_30;
  TPZAutoPointer<TPZSavable> local_28;
  
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar2 = (TPZGeoMesh *)0x0;
  }
  else {
    pTVar2 = (TPZGeoMesh *)__dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZGeoMesh::typeinfo,0);
  }
  this->fGeoMesh = pTVar2;
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar3 = (TPZCompMesh *)0x0;
  }
  else {
    pTVar3 = (TPZCompMesh *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZCompMesh::typeinfo,0xffffffffffffffff);
  }
  this->fCompMesh = pTVar3;
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar4 = (TPZGraphMesh *)0x0;
  }
  else {
    pTVar4 = (TPZGraphMesh *)__dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  this->fGraphMesh[0] = pTVar4;
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar4 = (TPZGraphMesh *)0x0;
  }
  else {
    pTVar4 = (TPZGraphMesh *)__dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  this->fGraphMesh[1] = pTVar4;
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar4 = (TPZGraphMesh *)0x0;
  }
  else {
    pTVar4 = (TPZGraphMesh *)__dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  this->fGraphMesh[2] = pTVar4;
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_40,1);
  this->fSolType = (ESolType)local_40.fRef;
  TPZSolutionMatrix::Read(&this->fSolution,buf,context);
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar5 = (TPZSolver *)0x0;
  }
  else {
    pTVar5 = (TPZSolver *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  }
  this->fSolver = pTVar5;
  TPZStream::Read<std::__cxx11::string>(buf,this->fScalarNames,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fScalarNames + 1,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fScalarNames + 2,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fVectorNames,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fVectorNames + 1,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fVectorNames + 2,(void *)0x0);
  (*buf->_vptr_TPZStream[0x1d])(buf,&this->fStep,1);
  (*buf->_vptr_TPZStream[0x1d])(buf,&this->fNthreadsError,1);
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_28,buf);
  TPZAutoPointerDynamicCast<TPZStructMatrix,TPZSavable>((TPZAutoPointer<TPZSavable> *)&local_40);
  TPZAutoPointer<TPZStructMatrix>::operator=(&this->fStructMatrix,&local_40);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_40);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_28);
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_30,buf);
  TPZAutoPointerDynamicCast<TPZRenumbering,TPZSavable>((TPZAutoPointer<TPZSavable> *)&local_40);
  TPZAutoPointer<TPZRenumbering>::operator=
            (&this->fRenumber,(TPZAutoPointer<TPZRenumbering> *)&local_40);
  TPZAutoPointer<TPZRenumbering>::~TPZAutoPointer((TPZAutoPointer<TPZRenumbering> *)&local_40);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_30);
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_38,buf);
  TPZAutoPointerDynamicCast<TPZGuiInterface,TPZSavable>((TPZAutoPointer<TPZSavable> *)&local_40);
  TPZAutoPointer<TPZGuiInterface>::operator=
            (&this->fGuiInterface,(TPZAutoPointer<TPZGuiInterface> *)&local_40);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)&local_40);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_38);
  TTablePostProcess::Read(&this->fTable,buf,context_00);
  TPZStream::Read<std::__cxx11::string>(buf,this->fTensorNames,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fTensorNames + 1,(void *)0x0);
  TPZStream::Read<std::__cxx11::string>(buf,this->fTensorNames + 2,(void *)0x0);
  return;
}

Assistant:

void TPZAnalysis::Read(TPZStream &buf, void *context){
    fGeoMesh = dynamic_cast<TPZGeoMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fCompMesh = dynamic_cast<TPZCompMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[0] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[1] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[2] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fSolType = [&buf](){
        int tmp;
        buf.Read(&tmp);
        return (ESolType) tmp;
    }();
    fSolution.Read(buf,context);
    fSolver = dynamic_cast<TPZMatrixSolver<STATE>*>(TPZPersistenceManager::GetInstance(&buf));
    buf.Read(fScalarNames[0]);
    buf.Read(fScalarNames[1]);
    buf.Read(fScalarNames[2]);
    buf.Read(fVectorNames[0]);
    buf.Read(fVectorNames[1]);
    buf.Read(fVectorNames[2]);
    buf.Read(&fStep);
    buf.Read(&fNthreadsError);
    fStructMatrix = TPZAutoPointerDynamicCast<TPZStructMatrix>(TPZPersistenceManager::GetAutoPointer(&buf));
    fRenumber = TPZAutoPointerDynamicCast<TPZRenumbering>(TPZPersistenceManager::GetAutoPointer(&buf));
    fGuiInterface = TPZAutoPointerDynamicCast<TPZGuiInterface>(TPZPersistenceManager::GetAutoPointer(&buf));
    fTable.Read(buf,context);
    buf.Read(fTensorNames[0]);
    buf.Read(fTensorNames[1]);
    buf.Read(fTensorNames[2]);
}